

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DP.c
# Opt level: O1

void pnga_copy_patch_dp(char *t_a,Integer g_a,Integer ailo,Integer aihi,Integer ajlo,Integer ajhi,
                       Integer g_b,Integer bilo,Integer bihi,Integer bjlo,Integer bjhi)

{
  long lVar1;
  byte bVar2;
  undefined8 *puVar3;
  Integer IVar4;
  long lVar5;
  char cVar6;
  Integer IVar7;
  undefined8 *puVar8;
  long lVar9;
  undefined8 *puVar10;
  Integer IVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  bool bVar15;
  Integer ld;
  Integer hi [2];
  Integer lo [2];
  Integer btype;
  Integer ndim;
  Integer atype;
  Integer dims [2];
  undefined8 *local_d8;
  undefined8 *local_b8;
  long local_b0;
  ulong local_a8;
  Integer local_a0;
  long local_98;
  Integer local_90;
  long local_88;
  long local_80;
  long local_78;
  long local_70;
  long local_60;
  Integer local_58;
  long local_50;
  long local_48;
  long local_40;
  
  local_90 = ailo;
  local_a8 = pnga_nodeid();
  local_b8 = (undefined8 *)0x0;
  pnga_check_handle(g_a,"pnga_copy_patch_dp");
  pnga_check_handle(g_b,"pnga_copy_patch_dp");
  local_a0 = g_a;
  pnga_inquire(g_a,&local_50,&local_58,&local_48);
  lVar5 = local_40;
  lVar13 = local_48;
  pnga_inquire(g_b,&local_60,&local_58,&local_48);
  local_b0 = local_40;
  if ((local_50 != 0x3ec) || (local_60 != 0x3ec)) {
    pnga_error("pnga_copy_patch_dp: wrong types ",0);
  }
  IVar4 = local_90;
  if ((((local_90 < 1) || (ajlo < 1)) || (lVar13 < aihi)) || (lVar5 < ajhi)) {
    pnga_error(" pnga_copy_patch_dp: g_a indices out of range ",0);
  }
  if (((bilo < 1) || (bjlo < 1)) || ((local_48 < bihi || (local_b0 < bjhi)))) {
    pnga_error(" pnga_copy_patch_dp: g_b indices out of range ",0);
  }
  if ((bihi - bilo != aihi - IVar4) || (bjhi - bjlo != ajhi - ajlo)) {
    pnga_error(" pnga_copy_patch_dp: shapes two of patches do not match ",0);
  }
  bVar2 = *t_a;
  pnga_distribution(local_a0,local_a8,&local_78,&local_88);
  bVar15 = true;
  IVar7 = local_88;
  IVar11 = local_70;
  lVar13 = local_78;
  if (((local_70 <= local_80 && (local_78 <= local_88 && (ajlo <= ajhi && IVar4 <= aihi))) &&
      (IVar4 <= local_88 && local_78 <= aihi)) && (ajlo <= local_80 && local_70 <= ajhi)) {
    if (local_78 <= IVar4) {
      local_78 = IVar4;
    }
    if (aihi <= local_88) {
      local_88 = aihi;
    }
    if (local_70 <= ajlo) {
      local_70 = ajlo;
    }
    if (ajhi <= local_80) {
      local_80 = ajhi;
    }
    bVar15 = false;
    IVar7 = local_88;
    IVar11 = local_70;
    lVar13 = local_78;
  }
  if (!bVar15) {
    pnga_access_ptr(local_a0,&local_78,&local_88,&local_b8,&local_98);
    if ((bVar2 & 0xdf) == 0x4e) {
      local_d8 = (undefined8 *)0x0;
      local_78 = lVar13;
      lVar5 = IVar7;
      lVar13 = IVar11;
      IVar7 = local_80;
      cVar6 = 'N';
    }
    else {
      local_a8 = CONCAT71(local_a8._1_7_,bVar2) & 0xffffffffffffffdf;
      lVar5 = (IVar7 - lVar13) + 1;
      lVar14 = local_80 - IVar11;
      lVar1 = lVar14 + 1;
      local_b0 = local_80;
      local_d8 = (undefined8 *)pnga_malloc(lVar1 * lVar5,0x3f5,"copypatch_dp");
      if (-1 < lVar14) {
        puVar3 = local_b8;
        puVar8 = local_d8;
        lVar9 = 0;
        do {
          if (-1 < IVar7 - lVar13) {
            lVar12 = 0;
            puVar10 = puVar8;
            do {
              *puVar10 = puVar3[lVar12];
              lVar12 = lVar12 + 1;
              puVar10 = puVar10 + lVar1;
            } while (lVar5 != lVar12);
          }
          puVar8 = puVar8 + 1;
          puVar3 = puVar3 + local_98;
          bVar15 = lVar9 != lVar14;
          lVar9 = lVar9 + 1;
        } while (bVar15);
      }
      pnga_release(local_a0,&local_78,&local_88);
      local_78 = IVar11;
      IVar4 = ajlo;
      lVar5 = local_b0;
      ajlo = local_90;
      cVar6 = (char)local_a8;
      local_b8 = local_d8;
      local_98 = lVar1;
    }
    local_78 = local_78 + (bilo - IVar4);
    local_88 = (bilo - IVar4) + lVar5;
    local_70 = lVar13 + (bjlo - ajlo);
    local_80 = (bjlo - ajlo) + IVar7;
    pnga_put(g_b,&local_78,&local_88,local_b8,&local_98);
    if (cVar6 != 'N') {
      pnga_free(local_d8);
    }
  }
  return;
}

Assistant:

void pnga_copy_patch_dp(t_a, g_a, ailo, aihi, ajlo, ajhi,
                   g_b, bilo, bihi, bjlo, bjhi)
     Integer g_a, ailo, aihi, ajlo, ajhi;
     Integer g_b, bilo, bihi, bjlo, bjhi;
     char *t_a;
{
Integer atype, btype, adim1, adim2, bdim1, bdim2;
Integer ilos, ihis, jlos, jhis;
Integer ilod, ihid, jlod, jhid, corr, nelem;
Integer me= pnga_nodeid(), ld, i,j;
Integer lo[2], hi[2];
Integer ldT;
char transp;
DoublePrecision *dbl_ptrA=NULL, *dbl_ptrB=NULL;
Integer ndim, dims[2];

   pnga_check_handle(g_a, "pnga_copy_patch_dp");
   pnga_check_handle(g_b, "pnga_copy_patch_dp");

   /* if(g_a == g_b) pnga_error("pnga_copy_patch_dp: arrays have to different ", 0L); */

   pnga_inquire(g_a, &atype, &ndim, dims);
   adim1 = dims[0];
   adim2 = dims[1];
   pnga_inquire(g_b, &btype, &ndim, dims);
   bdim1 = dims[0];
   bdim2 = dims[1];

   if(atype != btype || (atype != C_DBL ))
      pnga_error("pnga_copy_patch_dp: wrong types ", 0L);

   /* check if patch indices and dims match */
   if (ailo <= 0 || aihi > adim1 || ajlo <= 0 || ajhi > adim2)
       pnga_error(" pnga_copy_patch_dp: g_a indices out of range ", 0L);
   if (bilo <= 0 || bihi > bdim1 || bjlo <= 0 || bjhi > bdim2)
       pnga_error(" pnga_copy_patch_dp: g_b indices out of range ", 0L);

   /* check if numbers of elements in two patches match each other */
   if (((bihi - bilo + 1)  != (aihi - ailo + 1)) || 
      ( (bjhi - bjlo + 1)  != (ajhi - ajlo + 1)) )
       pnga_error(" pnga_copy_patch_dp: shapes two of patches do not match ", 0L);

    /* is transpose operation required ? */
   transp = (*t_a == 'n' || *t_a =='N')? 'n' : 't';

   /* now find out cordinates of a patch of g_a that I own */
   pnga_distribution(g_a, me, lo, hi);
   ilos = lo[0];
   jlos = lo[1];
   ihis = hi[0];
   jhis = hi[1];

   if(patch_intersect(ailo, aihi, ajlo, ajhi, &ilos, &ihis, &jlos, &jhis)){
      pnga_access_ptr(g_a, lo, hi, &dbl_ptrA, &ld);
      
      nelem = (ihis-ilos+1)*(jhis-jlos+1);
      
      if ( transp == 'n' ) {
	  corr  = bilo - ailo;
	  ilod  = ilos + corr; 
	  ihid  = ihis + corr;
	  corr  = bjlo - ajlo;
	  jlod  = jlos + corr; 
	  jhid  = jhis + corr;
      } else {
	/* If this is a transpose copy, we need local scratch space */
	dbl_ptrB = (DoublePrecision*) pnga_malloc(nelem,MT_F_DBL,"copypatch_dp");

	  /* Copy from the source into this local array, transposed */
	  ldT = jhis-jlos+1;
	  
	  for(j=0; j< jhis-jlos+1; j++)
	      for(i=0; i< ihis-ilos+1; i++)
		  *(dbl_ptrB + i*ldT + j) = *(dbl_ptrA + j*ld + i);

	  /* Now we can reset index to point to the transposed stuff */
      pnga_release(g_a, lo, hi);
	  dbl_ptrA = dbl_ptrB;
	  ld = ldT;

	  /* And finally, figure out what the destination indices are */
	  corr  = bilo - ajlo;
	  ilod  = jlos + corr; 
	  ihid  = jhis + corr;
	  corr  = bjlo - ailo;
	  jlod  = ilos + corr; 
	  jhid  = ihis + corr;
      }
	  
      /* Put it where it belongs */
      lo[0] = ilod;
      lo[1] = jlod;
      hi[0] = ihid;
      hi[1] = jhid;
      pnga_put(g_b, lo, hi, dbl_ptrA, &ld);

      /* Get rid of local memory if we used it */
      if( transp == 't') pnga_free(dbl_ptrB);
  }
}